

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O0

void DefineSourceFileProperty(void *arg,char *name,char *briefDocs,char *longDocs,int chained)

{
  char *__s;
  cmState *this;
  allocator<char> local_59;
  string local_58;
  void *local_38;
  cmMakefile *mf;
  char *pcStack_28;
  int chained_local;
  char *longDocs_local;
  char *briefDocs_local;
  char *name_local;
  void *arg_local;
  
  local_38 = arg;
  mf._4_4_ = chained;
  pcStack_28 = longDocs;
  longDocs_local = briefDocs;
  briefDocs_local = name;
  name_local = (char *)arg;
  this = cmMakefile::GetState((cmMakefile *)arg);
  __s = briefDocs_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,__s,&local_59);
  cmState::DefineProperty(this,&local_58,SOURCE_FILE,longDocs_local,pcStack_28,mf._4_4_ != 0);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  return;
}

Assistant:

void CCONV DefineSourceFileProperty(void* arg, const char* name,
                                    const char* briefDocs,
                                    const char* longDocs, int chained)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  mf->GetState()->DefineProperty(name, cmProperty::SOURCE_FILE, briefDocs,
                                 longDocs, chained != 0);
}